

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O3

void juzzlin::StreamTest::testTag_warningLevel_shouldPrintTag
               (string *message,string *timestampSeparator)

{
  ostream *poVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string tag;
  stringstream ss;
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  juzzlin::SimpleLogger::setStream(Warning,local_198);
  juzzlin::SimpleLogger::setLoggingLevel(Warning);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"TAG","");
  juzzlin::SimpleLogger::SimpleLogger((SimpleLogger *)&local_208,(string *)&local_1c8);
  poVar1 = (ostream *)juzzlin::SimpleLogger::fatal_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
  juzzlin::SimpleLogger::~SimpleLogger((SimpleLogger *)&local_208);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,local_1c8,local_1c0 + (long)local_1c8);
  std::__cxx11::string::append((char *)local_1e8);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_1e8,(ulong)(message->_M_dataplus)._M_p);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_208.field_2._M_allocated_capacity = *psVar3;
    local_208.field_2._8_8_ = plVar2[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar3;
    local_208._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_208._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  assertString((stringstream *)local_1a8,&local_208);
  assertString((stringstream *)local_1a8,timestampSeparator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void testTag_warningLevel_shouldPrintTag(const std::string & message, const std::string & timestampSeparator)
{
    std::stringstream ss;
    L::setStream(L::Level::Warning, ss);
    L::setLoggingLevel(L::Level::Warning);
    const std::string tag = "TAG";
    L(tag).fatal() << message;
    assertMessage(ss, tag + ": " + message, timestampSeparator);
}